

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteMode(ON_BinaryArchive *this)

{
  bool local_11;
  bool bIsWriting;
  ON_BinaryArchive *this_local;
  
  local_11 = false;
  switch(this->m_mode) {
  case unset_archive_mode:
    break;
  case read:
    break;
  case write:
    local_11 = true;
    break;
  case readwrite:
    local_11 = true;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x4039,"","Invalid m_mode.");
    break;
  case read3dm:
    break;
  case write3dm:
    local_11 = true;
  }
  return local_11;
}

Assistant:

bool ON_BinaryArchive::WriteMode() const
{
  bool bIsWriting = false;

  switch (m_mode)
  {
  case ON::archive_mode::unset_archive_mode:
    break;
  case ON::archive_mode::read:
    break;
  case ON::archive_mode::write:
    bIsWriting = true;
    break;
  case ON::archive_mode::readwrite:
    bIsWriting = true;
    break;
  case ON::archive_mode::read3dm:
    break;
  case ON::archive_mode::write3dm:
    bIsWriting = true;
    break;
  default:
    ON_ERROR("Invalid m_mode.");
    break;
  }

  return bIsWriting;
}